

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgLongPoll.cpp
# Opt level: O0

void __thiscall TgBot::TgLongPoll::start(TgLongPoll *this)

{
  EventHandler *this_00;
  bool bVar1;
  element_type *peVar2;
  shared_ptr<TgBot::Update> local_58;
  __shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_48;
  Ptr *item;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<TgBot::Update>,_std::allocator<std::shared_ptr<TgBot::Update>_>_> *__range1
  ;
  vector<std::shared_ptr<TgBot::Update>,_std::allocator<std::shared_ptr<TgBot::Update>_>_> updates;
  TgLongPoll *this_local;
  
  updates.
  super__Vector_base<std::shared_ptr<TgBot::Update>,_std::allocator<std::shared_ptr<TgBot::Update>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  Api::getUpdates((vector<std::shared_ptr<TgBot::Update>,_std::allocator<std::shared_ptr<TgBot::Update>_>_>
                   *)&__range1,this->_api,this->_lastUpdateId,this->_limit,this->_timeout,
                  &this->_allowupdates);
  __end1 = std::
           vector<std::shared_ptr<TgBot::Update>,_std::allocator<std::shared_ptr<TgBot::Update>_>_>
           ::begin((vector<std::shared_ptr<TgBot::Update>,_std::allocator<std::shared_ptr<TgBot::Update>_>_>
                    *)&__range1);
  item = (Ptr *)std::
                vector<std::shared_ptr<TgBot::Update>,_std::allocator<std::shared_ptr<TgBot::Update>_>_>
                ::end((vector<std::shared_ptr<TgBot::Update>,_std::allocator<std::shared_ptr<TgBot::Update>_>_>
                       *)&__range1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<TgBot::Update>_*,_std::vector<std::shared_ptr<TgBot::Update>,_std::allocator<std::shared_ptr<TgBot::Update>_>_>_>
                                *)&item);
    if (!bVar1) break;
    local_48 = (__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<std::shared_ptr<TgBot::Update>_*,_std::vector<std::shared_ptr<TgBot::Update>,_std::allocator<std::shared_ptr<TgBot::Update>_>_>_>
               ::operator*(&__end1);
    peVar2 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_48);
    if (this->_lastUpdateId <= peVar2->updateId) {
      peVar2 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_48);
      this->_lastUpdateId = peVar2->updateId + 1;
    }
    this_00 = this->_eventHandler;
    std::shared_ptr<TgBot::Update>::shared_ptr(&local_58,(shared_ptr<TgBot::Update> *)local_48);
    EventHandler::handleUpdate(this_00,&local_58);
    std::shared_ptr<TgBot::Update>::~shared_ptr(&local_58);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<TgBot::Update>_*,_std::vector<std::shared_ptr<TgBot::Update>,_std::allocator<std::shared_ptr<TgBot::Update>_>_>_>
    ::operator++(&__end1);
  }
  std::vector<std::shared_ptr<TgBot::Update>,_std::allocator<std::shared_ptr<TgBot::Update>_>_>::
  ~vector((vector<std::shared_ptr<TgBot::Update>,_std::allocator<std::shared_ptr<TgBot::Update>_>_>
           *)&__range1);
  return;
}

Assistant:

void TgLongPoll::start() {
    std::vector<Update::Ptr> updates = _api->getUpdates(_lastUpdateId, _limit, _timeout, _allowupdates);
    for (Update::Ptr& item : updates) {
        if (item->updateId >= _lastUpdateId) {
            _lastUpdateId = item->updateId + 1;
        }
        _eventHandler->handleUpdate(item);
    }
}